

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O0

int __thiscall ncnn::Convolution_x86_avx::create_pipeline(Convolution_x86_avx *this,Option *opt)

{
  long lVar1;
  long *plVar2;
  int *piVar3;
  ulong uVar4;
  bool bVar5;
  Layer *pLVar6;
  undefined8 *puVar7;
  reference pvVar8;
  byte *in_RSI;
  long *in_RDI;
  Mat weights_3 [1];
  Mat weights_2 [2];
  float *k00;
  int i;
  int k;
  int p;
  float *g00;
  int q;
  Mat weight_data_r2;
  Mat tmp;
  ParamDict pd_1;
  int maxk;
  bool prefer_sgemm;
  int l2_cache_size;
  bool prefer_winograd43;
  bool prefer_winograd23;
  bool prefer_winograd63;
  int h;
  int w;
  bool prefer_winograd;
  int out_elempack;
  int elempack;
  Mat weights_1 [1];
  Mat weights [2];
  ParamDict pd;
  int num_input;
  int kernel_size;
  Mat *m;
  undefined4 in_stack_fffffffffffff530;
  int in_stack_fffffffffffff534;
  Allocator *in_stack_fffffffffffff538;
  int in_stack_fffffffffffff540;
  undefined4 in_stack_fffffffffffff544;
  Mat *in_stack_fffffffffffff548;
  void **ppvVar9;
  Mat *in_stack_fffffffffffff550;
  int in_stack_fffffffffffff564;
  int in_stack_fffffffffffff568;
  int in_stack_fffffffffffff56c;
  Convolution_x86_avx *in_stack_fffffffffffff570;
  void **local_a78;
  void **local_a40;
  Option *in_stack_fffffffffffff5e0;
  Mat *in_stack_fffffffffffff5e8;
  undefined8 in_stack_fffffffffffff5f0;
  void **local_9f8;
  Allocator *in_stack_fffffffffffff620;
  void **ppvVar10;
  undefined8 in_stack_fffffffffffff628;
  undefined8 in_stack_fffffffffffff630;
  Mat *in_stack_fffffffffffff638;
  void **local_9b0;
  int in_stack_fffffffffffff6a0;
  undefined3 uVar11;
  undefined4 in_stack_fffffffffffff6a4;
  int kernel_w;
  undefined8 in_stack_fffffffffffff6a8;
  undefined5 in_stack_fffffffffffff6b0;
  undefined1 in_stack_fffffffffffff6b5;
  undefined1 in_stack_fffffffffffff6b6;
  undefined1 uVar12;
  int in_stack_fffffffffffff6b8;
  int in_stack_fffffffffffff6bc;
  void **local_900;
  Option *in_stack_fffffffffffff728;
  undefined8 in_stack_fffffffffffff730;
  int iVar13;
  Mat *in_stack_fffffffffffff738;
  int in_stack_fffffffffffff740;
  int in_stack_fffffffffffff744;
  Mat *in_stack_fffffffffffff748;
  Mat *in_stack_fffffffffffff750;
  void **local_888;
  void **local_840;
  undefined1 local_828 [16];
  void *local_818;
  int *local_810;
  void *local_808;
  undefined4 local_800;
  long *local_7f8;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined4 local_7e4;
  undefined4 local_7e0;
  void *local_7d8;
  void *pvStack_7d0;
  undefined1 local_7c8 [16];
  void *local_7b8;
  int *local_7b0;
  long *local_798;
  int in_stack_fffffffffffff880;
  int in_stack_fffffffffffff888;
  void *local_770;
  int *local_768;
  undefined8 local_760;
  undefined4 local_758;
  long *local_750;
  undefined4 local_748;
  undefined4 local_744;
  undefined4 local_740;
  undefined4 local_73c;
  undefined4 local_738;
  undefined8 local_730;
  void *pvStack_728;
  undefined8 local_720;
  undefined8 local_718;
  undefined8 local_710;
  undefined4 local_708;
  long *local_700;
  undefined4 local_6f8;
  undefined4 local_6f4;
  undefined4 local_6f0;
  undefined4 local_6ec;
  undefined4 local_6e8;
  undefined8 local_6e0;
  void *local_6d8;
  int local_6cc;
  int local_6c8;
  int local_6c4;
  undefined4 *local_6c0;
  int local_6b4;
  void *local_6b0;
  int *local_6a8;
  long local_6a0;
  undefined4 local_698;
  long *local_690;
  undefined4 local_688;
  int local_684;
  int local_680;
  undefined4 local_67c;
  undefined4 local_678;
  long local_670;
  void *local_668;
  int *local_660;
  long local_658;
  undefined4 local_650;
  long *local_648;
  undefined4 local_640;
  int local_63c;
  undefined4 local_638;
  undefined4 local_634;
  undefined4 local_630;
  undefined8 local_628;
  ParamDict local_620;
  int local_60c;
  char local_605;
  int local_604;
  byte local_5ff;
  bool local_5fe;
  byte local_5fd;
  int local_5fc;
  int local_5f8;
  undefined1 local_5f1;
  int local_5f0;
  int local_5ec;
  undefined1 local_5e8 [16];
  void *local_5d8;
  int *local_5d0;
  void *local_5c8;
  undefined4 local_5c0;
  long *local_5b8;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  undefined4 local_5a4;
  undefined4 local_5a0;
  void *local_598;
  void *pvStack_590;
  undefined1 local_588 [16];
  void *local_578;
  int *local_570;
  void *local_568;
  undefined4 local_560;
  long *local_558;
  undefined4 local_550;
  undefined4 local_54c;
  undefined4 local_548;
  undefined4 local_544;
  int in_stack_fffffffffffffac0;
  int in_stack_fffffffffffffac4;
  int in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffacc;
  Mat *in_stack_fffffffffffffad0;
  Mat *in_stack_fffffffffffffad8;
  long *local_510;
  void *apvStack_4e8 [3];
  ParamDict local_4d0;
  int local_4c0;
  int local_4bc;
  byte *local_4b8;
  int local_4a4;
  void **local_4a0;
  void **local_498;
  void **local_490;
  void **local_488;
  void **local_480;
  void **local_470;
  void **local_458;
  undefined8 *local_448;
  void **local_438;
  void **local_420;
  void **local_408;
  void **local_3f8;
  int local_3e8;
  undefined4 local_3e4;
  void **local_3e0;
  void **local_3d8;
  void **local_3d0;
  int local_3c8;
  undefined4 local_3c4;
  void **local_3c0;
  void **local_3b8;
  void **local_3b0;
  int local_3a8;
  undefined4 local_3a4;
  void **local_3a0;
  void **local_398;
  void **local_390;
  int local_388;
  undefined4 local_384;
  void **local_380;
  void **local_378;
  void **local_370;
  int local_368;
  undefined4 local_364;
  undefined1 *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  int local_348;
  undefined4 local_344;
  void **local_340;
  void **local_338;
  void **local_330;
  int local_328;
  undefined4 local_324;
  void **local_320;
  int local_318;
  undefined4 local_314;
  undefined1 *local_310;
  int local_308;
  undefined4 local_304;
  void **local_300;
  int local_2f8;
  undefined4 local_2f4;
  void **local_2f0;
  int local_2e8;
  undefined4 local_2e4;
  void **local_2e0;
  int local_2d8;
  undefined4 local_2d4;
  void **local_2d0;
  int local_2b8;
  undefined4 local_2b4;
  void **local_2b0;
  int local_298;
  undefined4 local_294;
  void **local_290;
  int local_268;
  undefined4 local_264;
  void **local_260;
  int local_238;
  undefined4 local_234;
  void **local_230;
  undefined8 *local_210;
  int local_1f8;
  undefined4 local_1f4;
  void **local_1f0;
  int local_1c8;
  undefined4 local_1c4;
  void **local_1c0;
  int local_1a8;
  undefined4 local_1a4;
  undefined8 *local_1a0;
  int local_198;
  undefined4 local_194;
  undefined8 *local_190;
  int local_188;
  undefined4 local_184;
  undefined8 *local_180;
  int local_174;
  undefined8 *local_170;
  int local_164;
  void **local_160;
  undefined1 local_155;
  int local_154;
  void **local_150;
  undefined8 *local_148;
  void *local_120;
  void *local_118;
  void *local_110;
  void *local_100;
  void *local_e8;
  void *local_b0;
  void *local_98;
  void *local_88;
  void *local_30;
  undefined8 *local_18;
  undefined4 local_c;
  long local_8;
  
  iVar13 = (int)((ulong)in_stack_fffffffffffff628 >> 0x20);
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x158) == 0) {
    local_4b8 = in_RSI;
    pLVar6 = create_activation_layer
                       ((int)((ulong)in_stack_fffffffffffff5f0 >> 0x20),in_stack_fffffffffffff5e8,
                        in_stack_fffffffffffff5e0);
    in_RDI[1] = (long)pLVar6;
    *(undefined4 *)(in_RDI + 2) = *(undefined4 *)(local_4b8 + 4);
    if (((local_4b8[0x1e] & 1) == 0) ||
       (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x170) != 1)) {
      local_4bc = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
      uVar4 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) / (long)local_4bc;
      local_4c0 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                       (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
      if ((((local_4b8[0x27] & 1) == 0) &&
          (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) ==
             *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) &&
            (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1)) &&
           (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) ==
            *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc))))) &&
         ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
          (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
        pLVar6 = create_layer((int)((ulong)in_stack_fffffffffffff538 >> 0x20));
        in_RDI[0x30] = (long)pLVar6;
        ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff550);
        ParamDict::set(&local_4d0,0,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
        ParamDict::set(&local_4d0,1,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4));
        ParamDict::set(&local_4d0,0xb,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8));
        ParamDict::set(&local_4d0,2,1);
        ParamDict::set(&local_4d0,0xc,1);
        ParamDict::set(&local_4d0,3,1);
        ParamDict::set(&local_4d0,0xd,1);
        ParamDict::set(&local_4d0,4,0);
        ParamDict::set(&local_4d0,0xe,0);
        ParamDict::set(&local_4d0,5,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100));
        ParamDict::set(&local_4d0,6,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104));
        (**(code **)(*(long *)in_RDI[0x30] + 0x10))((long *)in_RDI[0x30],&local_4d0);
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) == 0) {
          ppvVar9 = &local_5d8;
          do {
            local_498 = ppvVar9;
            *ppvVar9 = (void *)0x0;
            ppvVar9[1] = (void *)0x0;
            ppvVar9[2] = (void *)0x0;
            *(undefined4 *)(ppvVar9 + 3) = 0;
            ppvVar9[4] = (void *)0x0;
            *(undefined4 *)(ppvVar9 + 5) = 0;
            *(undefined4 *)((long)ppvVar9 + 0x2c) = 0;
            *(undefined4 *)(ppvVar9 + 6) = 0;
            *(undefined4 *)((long)ppvVar9 + 0x34) = 0;
            *(undefined4 *)(ppvVar9 + 7) = 0;
            ppvVar9[8] = (void *)0x0;
            ppvVar9 = ppvVar9 + 9;
          } while (ppvVar9 != &pvStack_590);
          lVar1 = *(long *)(*in_RDI + -0x18);
          local_380 = (void **)((long)in_RDI + lVar1 + 0x160);
          local_378 = &local_5d8;
          if (&local_5d8 != local_380) {
            if (*(long *)((long)in_RDI + lVar1 + 0x168) != 0) {
              piVar3 = *(int **)((long)in_RDI + lVar1 + 0x168);
              local_384 = 1;
              LOCK();
              local_388 = *piVar3;
              *piVar3 = *piVar3 + 1;
              UNLOCK();
            }
            local_300 = &local_5d8;
            if (local_5d0 != (int *)0x0) {
              local_304 = 0xffffffff;
              LOCK();
              local_308 = *local_5d0;
              *local_5d0 = *local_5d0 + -1;
              UNLOCK();
              if (local_308 == 1) {
                if (local_5b8 == (long *)0x0) {
                  if (local_5d8 != (void *)0x0) {
                    free(local_5d8);
                  }
                }
                else {
                  (**(code **)(*local_5b8 + 0x18))(local_5b8,local_5d8);
                }
              }
            }
            local_5d8 = *local_380;
            local_5d0 = (int *)local_380[1];
            local_5c8 = local_380[2];
            local_5c0 = *(undefined4 *)(local_380 + 3);
            local_5b8 = (long *)local_380[4];
            local_5b0 = *(undefined4 *)(local_380 + 5);
            local_5ac = *(undefined4 *)((long)local_380 + 0x2c);
            local_5a8 = *(undefined4 *)(local_380 + 6);
            local_5a4 = *(undefined4 *)((long)local_380 + 0x34);
            local_5a0 = *(undefined4 *)(local_380 + 7);
            local_598 = local_380[8];
          }
          plVar2 = (long *)in_RDI[0x30];
          local_370 = &local_5d8;
          ModelBinFromMatArray::ModelBinFromMatArray
                    ((ModelBinFromMatArray *)in_stack_fffffffffffff550,in_stack_fffffffffffff548);
          (**(code **)(*plVar2 + 0x18))(plVar2,local_5e8);
          ModelBinFromMatArray::~ModelBinFromMatArray
                    ((ModelBinFromMatArray *)
                     CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530));
          local_900 = &pvStack_590;
          do {
            ppvVar9 = local_900 + -9;
            local_458 = ppvVar9;
            local_1f0 = ppvVar9;
            if (local_900[-8] != (void *)0x0) {
              piVar3 = (int *)local_900[-8];
              local_1f4 = 0xffffffff;
              LOCK();
              local_1f8 = *piVar3;
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (local_1f8 == 1) {
                if (local_900[-5] == (void *)0x0) {
                  local_e8 = *ppvVar9;
                  if (local_e8 != (void *)0x0) {
                    free(local_e8);
                  }
                }
                else {
                  (**(code **)(*local_900[-5] + 0x18))(local_900[-5],*ppvVar9);
                }
              }
            }
            *ppvVar9 = (void *)0x0;
            local_900[-7] = (void *)0x0;
            *(undefined4 *)(local_900 + -6) = 0;
            *(undefined4 *)(local_900 + -4) = 0;
            *(undefined4 *)((long)local_900 + -0x1c) = 0;
            *(undefined4 *)(local_900 + -3) = 0;
            *(undefined4 *)((long)local_900 + -0x14) = 0;
            *(undefined4 *)(local_900 + -2) = 0;
            local_900[-1] = (void *)0x0;
            local_900[-8] = (void *)0x0;
            local_900 = ppvVar9;
          } while (ppvVar9 != &local_5d8);
        }
        else {
          local_840 = &local_578;
          do {
            local_4a0 = local_840;
            *local_840 = (void *)0x0;
            local_840[1] = (void *)0x0;
            local_840[2] = (void *)0x0;
            *(undefined4 *)(local_840 + 3) = 0;
            local_840[4] = (void *)0x0;
            *(undefined4 *)(local_840 + 5) = 0;
            *(undefined4 *)((long)local_840 + 0x2c) = 0;
            *(undefined4 *)(local_840 + 6) = 0;
            *(undefined4 *)((long)local_840 + 0x34) = 0;
            *(undefined4 *)(local_840 + 7) = 0;
            local_840[8] = (void *)0x0;
            local_840 = local_840 + 9;
          } while (local_840 != apvStack_4e8);
          lVar1 = *(long *)(*in_RDI + -0x18);
          local_340 = (void **)((long)in_RDI + lVar1 + 0x160);
          local_338 = &local_578;
          if (&local_578 != local_340) {
            if (*(long *)((long)in_RDI + lVar1 + 0x168) != 0) {
              piVar3 = *(int **)((long)in_RDI + lVar1 + 0x168);
              local_344 = 1;
              LOCK();
              local_348 = *piVar3;
              *piVar3 = *piVar3 + 1;
              UNLOCK();
            }
            local_320 = &local_578;
            if (local_570 != (int *)0x0) {
              local_324 = 0xffffffff;
              LOCK();
              local_328 = *local_570;
              *local_570 = *local_570 + -1;
              UNLOCK();
              if (local_328 == 1) {
                if (local_558 == (long *)0x0) {
                  if (local_578 != (void *)0x0) {
                    free(local_578);
                  }
                }
                else {
                  (**(code **)(*local_558 + 0x18))(local_558,local_578);
                }
              }
            }
            local_578 = *local_340;
            local_570 = (int *)local_340[1];
            local_568 = local_340[2];
            local_560 = *(undefined4 *)(local_340 + 3);
            local_558 = (long *)local_340[4];
            local_550 = *(undefined4 *)(local_340 + 5);
            local_54c = *(undefined4 *)((long)local_340 + 0x2c);
            local_548 = *(undefined4 *)(local_340 + 6);
            local_544 = *(undefined4 *)((long)local_340 + 0x34);
          }
          lVar1 = *(long *)(*in_RDI + -0x18);
          local_360 = (undefined1 *)((long)in_RDI + lVar1 + 0x1a8);
          local_358 = &stack0xfffffffffffffad0;
          local_330 = &local_578;
          if (&stack0xfffffffffffffad0 != local_360) {
            if (*(long *)((long)in_RDI + lVar1 + 0x1b0) != 0) {
              piVar3 = *(int **)((long)in_RDI + lVar1 + 0x1b0);
              local_364 = 1;
              LOCK();
              local_368 = *piVar3;
              *piVar3 = *piVar3 + 1;
              UNLOCK();
            }
            local_310 = &stack0xfffffffffffffad0;
            if (in_stack_fffffffffffffad8 != (Mat *)0x0) {
              local_314 = 0xffffffff;
              LOCK();
              local_318 = *(int *)&in_stack_fffffffffffffad8->data;
              *(int *)&in_stack_fffffffffffffad8->data =
                   *(int *)&in_stack_fffffffffffffad8->data + -1;
              UNLOCK();
              if (local_318 == 1) {
                if (local_510 == (long *)0x0) {
                  if (in_stack_fffffffffffffad0 != (Mat *)0x0) {
                    free(in_stack_fffffffffffffad0);
                  }
                }
                else {
                  (**(code **)(*local_510 + 0x18))(local_510,in_stack_fffffffffffffad0);
                }
              }
            }
          }
          plVar2 = (long *)in_RDI[0x30];
          local_350 = &stack0xfffffffffffffad0;
          ModelBinFromMatArray::ModelBinFromMatArray
                    ((ModelBinFromMatArray *)in_stack_fffffffffffff550,in_stack_fffffffffffff548);
          (**(code **)(*plVar2 + 0x18))(plVar2,local_588);
          ModelBinFromMatArray::~ModelBinFromMatArray
                    ((ModelBinFromMatArray *)
                     CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530));
          local_888 = apvStack_4e8;
          do {
            ppvVar9 = local_888 + -9;
            local_470 = ppvVar9;
            local_1c0 = ppvVar9;
            if (local_888[-8] != (void *)0x0) {
              piVar3 = (int *)local_888[-8];
              local_1c4 = 0xffffffff;
              LOCK();
              local_1c8 = *piVar3;
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (local_1c8 == 1) {
                if (local_888[-5] == (void *)0x0) {
                  local_100 = *ppvVar9;
                  if (local_100 != (void *)0x0) {
                    free(local_100);
                  }
                }
                else {
                  (**(code **)(*local_888[-5] + 0x18))(local_888[-5],*ppvVar9);
                }
              }
            }
            *ppvVar9 = (void *)0x0;
            local_888[-7] = (void *)0x0;
            *(undefined4 *)(local_888 + -6) = 0;
            *(undefined4 *)(local_888 + -4) = 0;
            *(undefined4 *)((long)local_888 + -0x1c) = 0;
            *(undefined4 *)(local_888 + -3) = 0;
            *(undefined4 *)((long)local_888 + -0x14) = 0;
            *(undefined4 *)(local_888 + -2) = 0;
            local_888[-1] = (void *)0x0;
            local_888[-8] = (void *)0x0;
            local_888 = ppvVar9;
          } while (ppvVar9 != &local_578);
        }
        (**(code **)(*(long *)in_RDI[0x30] + 0x20))((long *)in_RDI[0x30],local_4b8);
        if ((*local_4b8 & 1) != 0) {
          lVar1 = *(long *)(*in_RDI + -0x18);
          puVar7 = (undefined8 *)((long)in_RDI + lVar1 + 0x160);
          local_180 = puVar7;
          if (*(long *)((long)in_RDI + lVar1 + 0x168) != 0) {
            piVar3 = *(int **)((long)in_RDI + lVar1 + 0x168);
            local_184 = 0xffffffff;
            LOCK();
            local_188 = *piVar3;
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (local_188 == 1) {
              if (*(long *)((long)in_RDI + lVar1 + 0x180) == 0) {
                local_120 = (void *)*puVar7;
                if (local_120 != (void *)0x0) {
                  free(local_120);
                }
              }
              else {
                plVar2 = *(long **)((long)in_RDI + lVar1 + 0x180);
                (**(code **)(*plVar2 + 0x18))(plVar2,*puVar7);
              }
            }
          }
          *puVar7 = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x170) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x178) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x188) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x18c) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 400) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x194) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x198) = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x1a0) = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x168) = 0;
        }
        local_4a4 = 0;
        ParamDict::~ParamDict
                  ((ParamDict *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530));
      }
      else {
        local_5ec = 1;
        local_5f0 = 1;
        if ((local_4b8[0x27] & 1) != 0) {
          if (local_4c0 % 8 == 0) {
            in_stack_fffffffffffff6bc = 8;
          }
          else {
            in_stack_fffffffffffff6bc = 1;
            if (local_4c0 % 4 == 0) {
              in_stack_fffffffffffff6bc = 4;
            }
          }
          local_5ec = in_stack_fffffffffffff6bc;
          if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) {
            in_stack_fffffffffffff6b8 = 8;
            local_5f0 = in_stack_fffffffffffff6b8;
          }
          else {
            in_stack_fffffffffffff6b8 = 1;
            local_5f0 = in_stack_fffffffffffff6b8;
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) {
              in_stack_fffffffffffff6b8 = 4;
              local_5f0 = in_stack_fffffffffffff6b8;
            }
          }
        }
        if (((((local_4b8[0x37] & 1) != 0) || ((local_4b8[0x38] & 1) != 0)) ||
            (uVar12 = false, (local_4b8[0x39] & 1) != 0)) &&
           (in_stack_fffffffffffff6b6 = true, uVar12 = in_stack_fffffffffffff6b6, local_4c0 < 9)) {
          in_stack_fffffffffffff6b6 = 8 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
          ;
          uVar12 = in_stack_fffffffffffff6b6;
        }
        local_5f1 = uVar12;
        if ((((((local_4b8[0x1c] & 1) == 0) || ((bool)uVar12 == false)) ||
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) != 3)) ||
            ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) != 3 ||
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1)))) ||
           ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 1 ||
            ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 1 ||
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 1)))))) {
          local_604 = get_cpu_level2_cache_size();
          kernel_w = CONCAT13(1,(int3)in_stack_fffffffffffff6a4);
          if (local_4c0 * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) * 8 <= local_604) {
            uVar11 = CONCAT12(1,(short)in_stack_fffffffffffff6a4);
            if (local_4c0 < 0x11) {
              uVar11 = CONCAT12(0x10 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0),
                                (short)in_stack_fffffffffffff6a4);
            }
            kernel_w = CONCAT13((char)((uint3)uVar11 >> 0x10),uVar11);
          }
          local_605 = (char)((uint)kernel_w >> 0x18);
          if ((((local_4b8[0x1d] & 1) == 0) || (local_605 == '\0')) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) != 1 ||
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) != 1)))) {
            if (((((((((local_5ec == 0x10) && (local_5f0 == 1)) &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3)) &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)))) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) ||
                 ((((local_5ec == 8 &&
                    (((local_5f0 == 8 &&
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3)) &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)))) &&
                   (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1)))) &&
                  (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) ||
                (((local_5ec == 8 && (local_5f0 == 8)) &&
                 (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 2 &&
                   (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)))) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))))))) ||
               ((((local_5ec == 1 &&
                  (((local_5f0 == 8 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3 &&
                    ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
                       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)) &&
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1)) &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))))))) ||
                 ((((local_5ec == 1 && (local_5f0 == 8)) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3)) &&
                  (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))))))) ||
                (((((local_5ec == 8 &&
                    (((local_5f0 == 1 &&
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3)) &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)))) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)))) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) ||
                 ((((((local_5ec == 1 && (local_5f0 == 4)) &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3)) &&
                    (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3 &&
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)))) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) ||
                  ((((local_5ec == 1 &&
                     ((local_5f0 == 4 &&
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3)))) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
                   ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)) &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))))))))) {
              convolution_transform_kernel_packed_sse
                        ((Mat *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                         (Mat *)CONCAT17(uVar12,CONCAT16(in_stack_fffffffffffff6b6,
                                                         CONCAT15(in_stack_fffffffffffff6b5,
                                                                  in_stack_fffffffffffff6b0))),
                         (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20),
                         (int)in_stack_fffffffffffff6a8,kernel_w,in_stack_fffffffffffff6a0,
                         in_stack_fffffffffffff880,in_stack_fffffffffffff888);
            }
            else {
              convolution_transform_kernel_packed
                        (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                         in_stack_fffffffffffffacc,in_stack_fffffffffffffac8,
                         in_stack_fffffffffffffac4,in_stack_fffffffffffffac0);
            }
          }
          else {
            local_60c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
            pLVar6 = create_layer((int)((ulong)in_stack_fffffffffffff538 >> 0x20));
            in_RDI[0x31] = (long)pLVar6;
            ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff550);
            ParamDict::set(&local_620,2,0);
            ParamDict::set(&local_620,3,0);
            ParamDict::set(&local_620,4,1);
            ParamDict::set(&local_620,5,0);
            ParamDict::set(&local_620,6,1);
            ParamDict::set(&local_620,7,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
            ParamDict::set(&local_620,8,0);
            ParamDict::set(&local_620,9,local_60c * local_4c0);
            ParamDict::set(&local_620,10,
                           -(uint)(*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) == 0)
                           | 1);
            ParamDict::set(&local_620,0xb,1);
            (**(code **)(*(long *)in_RDI[0x31] + 0x10))((long *)in_RDI[0x31],&local_620);
            local_490 = &local_668;
            local_668 = (void *)0x0;
            local_660 = (int *)0x0;
            local_658 = 0;
            local_650 = 0;
            local_648 = (long *)0x0;
            local_640 = 0;
            local_63c = 0;
            local_638 = 0;
            local_634 = 0;
            local_630 = 0;
            local_628 = 0;
            Mat::reshape(in_stack_fffffffffffff638,(int)((ulong)in_stack_fffffffffffff630 >> 0x20),
                         (int)in_stack_fffffffffffff630,iVar13,in_stack_fffffffffffff620);
            Mat::create(in_stack_fffffffffffff550,(int)((ulong)in_stack_fffffffffffff548 >> 0x20),
                        (int)in_stack_fffffffffffff548,
                        CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                        in_stack_fffffffffffff538);
            for (local_6b4 = 0;
                local_6b4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
                local_6b4 = local_6b4 + 1) {
              local_160 = &local_668;
              local_164 = local_6b4;
              local_6c0 = (undefined4 *)
                          ((long)local_668 + (long)local_63c * (long)local_6b4 * local_658);
              for (local_6c4 = 0; local_6c4 + local_5ec + -1 < local_4c0;
                  local_6c4 = local_5ec + local_6c4) {
                for (local_6c8 = 0; local_6c8 < local_60c; local_6c8 = local_6c8 + 1) {
                  for (local_6cc = 0; local_6cc < local_5ec; local_6cc = local_6cc + 1) {
                    local_148 = &local_720;
                    local_150 = &local_6b0;
                    local_30 = (void *)((long)local_6b0 + local_670 * local_6b4 * local_6a0);
                    local_18 = &local_720;
                    local_700 = local_690;
                    local_8 = (long)local_684 * (long)local_680 * local_6a0;
                    local_c = 0x10;
                    local_154 = local_6b4;
                    local_155 = 1;
                    local_174 = local_6c4 + local_6cc;
                    local_170 = &local_720;
                    local_6d8 = (void *)((long)local_30 +
                                        (long)local_684 * (long)local_174 * local_6a0);
                    local_448 = &local_720;
                    local_720 = 0;
                    local_710 = 0;
                    local_708 = 0;
                    local_6f8 = 0;
                    local_6f4 = 0;
                    local_6f0 = 0;
                    local_6ec = 0;
                    local_6e8 = 0;
                    local_6e0 = 0;
                    local_718 = 0;
                    *local_6c0 = *(undefined4 *)((long)local_6d8 + (long)local_6c8 * 4);
                    local_6c0 = local_6c0 + 1;
                    local_210 = local_448;
                  }
                }
              }
            }
            local_438 = &local_6b0;
            local_230 = local_438;
            if (local_6a8 != (int *)0x0) {
              local_234 = 0xffffffff;
              LOCK();
              local_238 = *local_6a8;
              *local_6a8 = *local_6a8 + -1;
              UNLOCK();
              if (local_238 == 1) {
                if (local_690 == (long *)0x0) {
                  if (local_6b0 != (void *)0x0) {
                    free(local_6b0);
                  }
                }
                else {
                  (**(code **)(*local_690 + 0x18))(local_690,local_6b0);
                }
              }
            }
            local_6b0 = (void *)0x0;
            local_6a0 = 0;
            local_698 = 0;
            local_688 = 0;
            local_684 = 0;
            local_680 = 0;
            local_67c = 0;
            local_678 = 0;
            local_670 = 0;
            local_6a8 = (int *)0x0;
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) == 0) {
              local_a40 = &local_818;
              do {
                local_480 = local_a40;
                *local_a40 = (void *)0x0;
                local_a40[1] = (void *)0x0;
                local_a40[2] = (void *)0x0;
                *(undefined4 *)(local_a40 + 3) = 0;
                local_a40[4] = (void *)0x0;
                *(undefined4 *)(local_a40 + 5) = 0;
                *(undefined4 *)((long)local_a40 + 0x2c) = 0;
                *(undefined4 *)(local_a40 + 6) = 0;
                *(undefined4 *)((long)local_a40 + 0x34) = 0;
                *(undefined4 *)(local_a40 + 7) = 0;
                local_a40[8] = (void *)0x0;
                local_a40 = local_a40 + 9;
              } while (local_a40 != &pvStack_7d0);
              local_3e0 = &local_668;
              local_3d8 = &local_818;
              if (&local_818 != local_3e0) {
                if (local_660 != (int *)0x0) {
                  local_3e4 = 1;
                  LOCK();
                  local_3e8 = *local_660;
                  *local_660 = *local_660 + 1;
                  UNLOCK();
                }
                local_2d0 = &local_818;
                if (local_810 != (int *)0x0) {
                  local_2d4 = 0xffffffff;
                  LOCK();
                  local_2d8 = *local_810;
                  *local_810 = *local_810 + -1;
                  UNLOCK();
                  if (local_2d8 == 1) {
                    if (local_7f8 == (long *)0x0) {
                      if (local_818 != (void *)0x0) {
                        free(local_818);
                      }
                    }
                    else {
                      (**(code **)(*local_7f8 + 0x18))(local_7f8,local_818);
                    }
                  }
                }
                local_818 = *local_3e0;
                local_810 = (int *)local_3e0[1];
                local_808 = local_3e0[2];
                local_800 = *(undefined4 *)(local_3e0 + 3);
                local_7f8 = (long *)local_3e0[4];
                local_7f0 = *(undefined4 *)(local_3e0 + 5);
                local_7ec = *(undefined4 *)((long)local_3e0 + 0x2c);
                local_7e8 = *(undefined4 *)(local_3e0 + 6);
                local_7e4 = *(undefined4 *)((long)local_3e0 + 0x34);
                local_7e0 = *(undefined4 *)(local_3e0 + 7);
                local_7d8 = local_3e0[8];
              }
              plVar2 = (long *)in_RDI[0x31];
              local_3d0 = &local_818;
              ModelBinFromMatArray::ModelBinFromMatArray
                        ((ModelBinFromMatArray *)in_stack_fffffffffffff550,in_stack_fffffffffffff548
                        );
              (**(code **)(*plVar2 + 0x18))(plVar2,local_828);
              ModelBinFromMatArray::~ModelBinFromMatArray
                        ((ModelBinFromMatArray *)
                         CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530));
              local_a78 = &pvStack_7d0;
              do {
                ppvVar10 = local_a78 + -9;
                ppvVar9 = ppvVar10;
                local_408 = ppvVar10;
                local_290 = ppvVar10;
                if (local_a78[-8] != (void *)0x0) {
                  piVar3 = (int *)local_a78[-8];
                  local_294 = 0xffffffff;
                  LOCK();
                  local_298 = *piVar3;
                  *piVar3 = *piVar3 + -1;
                  UNLOCK();
                  if (local_298 == 1) {
                    if (local_a78[-5] == (void *)0x0) {
                      local_98 = *ppvVar10;
                      if (local_98 != (void *)0x0) {
                        free(local_98);
                      }
                    }
                    else {
                      (**(code **)(*local_a78[-5] + 0x18))(local_a78[-5],*ppvVar10);
                    }
                  }
                }
                *ppvVar10 = (void *)0x0;
                local_a78[-7] = (void *)0x0;
                *(undefined4 *)(local_a78 + -6) = 0;
                *(undefined4 *)(local_a78 + -4) = 0;
                *(undefined4 *)((long)local_a78 + -0x1c) = 0;
                *(undefined4 *)(local_a78 + -3) = 0;
                *(undefined4 *)((long)local_a78 + -0x14) = 0;
                *(undefined4 *)(local_a78 + -2) = 0;
                local_a78[-1] = (void *)0x0;
                local_a78[-8] = (void *)0x0;
                local_a78 = ppvVar9;
              } while (ppvVar9 != &local_818);
            }
            else {
              local_9b0 = &local_7b8;
              do {
                local_488 = local_9b0;
                *local_9b0 = (void *)0x0;
                local_9b0[1] = (void *)0x0;
                local_9b0[2] = (void *)0x0;
                *(undefined4 *)(local_9b0 + 3) = 0;
                local_9b0[4] = (void *)0x0;
                *(undefined4 *)(local_9b0 + 5) = 0;
                *(undefined4 *)((long)local_9b0 + 0x2c) = 0;
                *(undefined4 *)(local_9b0 + 6) = 0;
                *(undefined4 *)((long)local_9b0 + 0x34) = 0;
                *(undefined4 *)(local_9b0 + 7) = 0;
                local_9b0[8] = (void *)0x0;
                local_9b0 = local_9b0 + 9;
              } while (local_9b0 != &pvStack_728);
              ppvVar9 = &local_7b8;
              local_3a0 = &local_668;
              local_398 = ppvVar9;
              if (ppvVar9 != local_3a0) {
                if (local_660 != (int *)0x0) {
                  local_3a4 = 1;
                  LOCK();
                  local_3a8 = *local_660;
                  *local_660 = *local_660 + 1;
                  UNLOCK();
                }
                ppvVar10 = ppvVar9;
                local_2f0 = ppvVar9;
                if (local_7b0 != (int *)0x0) {
                  local_2f4 = 0xffffffff;
                  LOCK();
                  local_2f8 = *local_7b0;
                  *local_7b0 = *local_7b0 + -1;
                  UNLOCK();
                  if (local_2f8 == 1) {
                    if (local_798 == (long *)0x0) {
                      if (local_7b8 != (void *)0x0) {
                        free(local_7b8);
                      }
                    }
                    else {
                      (**(code **)(*local_798 + 0x18))(local_798,local_7b8);
                    }
                  }
                }
                *ppvVar9 = (void *)0x0;
                ppvVar9[2] = (void *)0x0;
                *(undefined4 *)(ppvVar9 + 3) = 0;
                *(undefined4 *)(ppvVar9 + 5) = 0;
                *(undefined4 *)((long)ppvVar9 + 0x2c) = 0;
                *(undefined4 *)(ppvVar9 + 6) = 0;
                *(undefined4 *)((long)ppvVar9 + 0x34) = 0;
                *(undefined4 *)(ppvVar9 + 7) = 0;
                ppvVar9[8] = (void *)0x0;
                ppvVar9[1] = (void *)0x0;
                *ppvVar10 = *local_3a0;
                ppvVar10[1] = local_3a0[1];
                ppvVar10[2] = local_3a0[2];
                *(undefined4 *)(ppvVar10 + 3) = *(undefined4 *)(local_3a0 + 3);
                ppvVar10[4] = local_3a0[4];
                *(undefined4 *)(ppvVar10 + 5) = *(undefined4 *)(local_3a0 + 5);
                *(undefined4 *)((long)ppvVar10 + 0x2c) = *(undefined4 *)((long)local_3a0 + 0x2c);
                *(undefined4 *)(ppvVar10 + 6) = *(undefined4 *)(local_3a0 + 6);
                *(undefined4 *)((long)ppvVar10 + 0x34) = *(undefined4 *)((long)local_3a0 + 0x34);
                *(undefined4 *)(ppvVar10 + 7) = *(undefined4 *)(local_3a0 + 7);
                ppvVar10[8] = local_3a0[8];
                ppvVar9 = ppvVar10;
              }
              lVar1 = *(long *)(*in_RDI + -0x18);
              local_3c0 = (void **)((long)in_RDI + lVar1 + 0x1a8);
              ppvVar10 = &local_770;
              local_3b8 = ppvVar10;
              local_390 = ppvVar9;
              if (ppvVar10 != local_3c0) {
                if (*(long *)((long)in_RDI + lVar1 + 0x1b0) != 0) {
                  piVar3 = *(int **)((long)in_RDI + lVar1 + 0x1b0);
                  local_3c4 = 1;
                  LOCK();
                  local_3c8 = *piVar3;
                  *piVar3 = *piVar3 + 1;
                  UNLOCK();
                }
                local_2e0 = ppvVar10;
                if (local_768 != (int *)0x0) {
                  local_2e4 = 0xffffffff;
                  LOCK();
                  local_2e8 = *local_768;
                  *local_768 = *local_768 + -1;
                  UNLOCK();
                  if (local_2e8 == 1) {
                    if (local_750 == (long *)0x0) {
                      if (local_770 != (void *)0x0) {
                        free(local_770);
                      }
                    }
                    else {
                      (**(code **)(*local_750 + 0x18))(local_750,local_770);
                    }
                  }
                }
                local_770 = (void *)0x0;
                local_760 = 0;
                local_758 = 0;
                local_748 = 0;
                local_744 = 0;
                local_740 = 0;
                local_73c = 0;
                local_738 = 0;
                local_730 = 0;
                local_768 = (int *)0x0;
                *ppvVar10 = *local_3c0;
                ppvVar10[1] = local_3c0[1];
                ppvVar10[2] = local_3c0[2];
                *(undefined4 *)(ppvVar10 + 3) = *(undefined4 *)(local_3c0 + 3);
                ppvVar10[4] = local_3c0[4];
                *(undefined4 *)(ppvVar10 + 5) = *(undefined4 *)(local_3c0 + 5);
                *(undefined4 *)((long)ppvVar10 + 0x2c) = *(undefined4 *)((long)local_3c0 + 0x2c);
                *(undefined4 *)(ppvVar10 + 6) = *(undefined4 *)(local_3c0 + 6);
                *(undefined4 *)((long)ppvVar10 + 0x34) = *(undefined4 *)((long)local_3c0 + 0x34);
                *(undefined4 *)(ppvVar10 + 7) = *(undefined4 *)(local_3c0 + 7);
                ppvVar10[8] = local_3c0[8];
              }
              plVar2 = (long *)in_RDI[0x31];
              local_3b0 = ppvVar10;
              ModelBinFromMatArray::ModelBinFromMatArray
                        ((ModelBinFromMatArray *)in_stack_fffffffffffff550,in_stack_fffffffffffff548
                        );
              (**(code **)(*plVar2 + 0x18))(plVar2,local_7c8);
              ModelBinFromMatArray::~ModelBinFromMatArray
                        ((ModelBinFromMatArray *)
                         CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530));
              local_9f8 = &pvStack_728;
              do {
                ppvVar10 = local_9f8 + -9;
                ppvVar9 = ppvVar10;
                local_420 = ppvVar10;
                local_260 = ppvVar10;
                if (local_9f8[-8] != (void *)0x0) {
                  piVar3 = (int *)local_9f8[-8];
                  local_264 = 0xffffffff;
                  LOCK();
                  local_268 = *piVar3;
                  *piVar3 = *piVar3 + -1;
                  UNLOCK();
                  if (local_268 == 1) {
                    if (local_9f8[-5] == (void *)0x0) {
                      local_b0 = *ppvVar10;
                      if (local_b0 != (void *)0x0) {
                        free(local_b0);
                      }
                    }
                    else {
                      (**(code **)(*local_9f8[-5] + 0x18))(local_9f8[-5],*ppvVar10);
                    }
                  }
                }
                *ppvVar10 = (void *)0x0;
                local_9f8[-7] = (void *)0x0;
                *(undefined4 *)(local_9f8 + -6) = 0;
                *(undefined4 *)(local_9f8 + -4) = 0;
                *(undefined4 *)((long)local_9f8 + -0x1c) = 0;
                *(undefined4 *)(local_9f8 + -3) = 0;
                *(undefined4 *)((long)local_9f8 + -0x14) = 0;
                *(undefined4 *)(local_9f8 + -2) = 0;
                local_9f8[-1] = (void *)0x0;
                local_9f8[-8] = (void *)0x0;
                local_9f8 = ppvVar9;
              } while (ppvVar9 != &local_7b8);
            }
            (**(code **)(*(long *)in_RDI[0x31] + 0x20))((long *)in_RDI[0x31],local_4b8);
            ppvVar9 = &local_668;
            local_3f8 = ppvVar9;
            local_2b0 = ppvVar9;
            if (local_660 != (int *)0x0) {
              local_2b4 = 0xffffffff;
              LOCK();
              local_2b8 = *local_660;
              *local_660 = *local_660 + -1;
              UNLOCK();
              if (local_2b8 == 1) {
                if (local_648 == (long *)0x0) {
                  local_88 = local_668;
                  if (local_668 != (void *)0x0) {
                    free(local_668);
                  }
                }
                else {
                  (**(code **)(*local_648 + 0x18))(local_648,local_668);
                }
              }
            }
            *ppvVar9 = (void *)0x0;
            ppvVar9[2] = (void *)0x0;
            *(undefined4 *)(ppvVar9 + 3) = 0;
            *(undefined4 *)(ppvVar9 + 5) = 0;
            *(undefined4 *)((long)ppvVar9 + 0x2c) = 0;
            *(undefined4 *)(ppvVar9 + 6) = 0;
            *(undefined4 *)((long)ppvVar9 + 0x34) = 0;
            *(undefined4 *)(ppvVar9 + 7) = 0;
            ppvVar9[8] = (void *)0x0;
            ppvVar9[1] = (void *)0x0;
            ParamDict::~ParamDict
                      ((ParamDict *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530));
          }
          if ((*local_4b8 & 1) != 0) {
            lVar1 = *(long *)(*in_RDI + -0x18);
            puVar7 = (undefined8 *)((long)in_RDI + lVar1 + 0x160);
            if (*(long *)((long)in_RDI + lVar1 + 0x168) != 0) {
              piVar3 = *(int **)((long)in_RDI + lVar1 + 0x168);
              local_1a4 = 0xffffffff;
              LOCK();
              local_1a8 = *piVar3;
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (local_1a8 == 1) {
                local_1a0 = puVar7;
                if (*(long *)((long)in_RDI + lVar1 + 0x180) == 0) {
                  local_110 = (void *)*puVar7;
                  if (local_110 != (void *)0x0) {
                    free(local_110);
                  }
                }
                else {
                  plVar2 = *(long **)((long)in_RDI + lVar1 + 0x180);
                  (**(code **)(*plVar2 + 0x18))(plVar2,*puVar7);
                }
              }
            }
            *puVar7 = 0;
            puVar7[2] = 0;
            *(undefined4 *)(puVar7 + 3) = 0;
            *(undefined4 *)(puVar7 + 5) = 0;
            *(undefined4 *)((long)puVar7 + 0x2c) = 0;
            *(undefined4 *)(puVar7 + 6) = 0;
            *(undefined4 *)((long)puVar7 + 0x34) = 0;
            *(undefined4 *)(puVar7 + 7) = 0;
            puVar7[8] = 0;
            puVar7[1] = 0;
          }
          local_4a4 = 0;
        }
        else {
          bVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::empty
                            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                             CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
          iVar13 = (int)in_stack_fffffffffffff570;
          if ((((bVar5) ||
               (pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                   ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                    ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa0),0),
               pvVar8->w == 0)) ||
              (pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                   ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa0),0),
              pvVar8->h == 0)) &&
             (((bVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::empty
                                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                   CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540)),
               bVar5 || (pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                             ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8),0),
                        pvVar8->w == 0)) ||
              (pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                   ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8),0),
              pvVar8->h == 0)))) {
            if ((((local_4b8[0x39] & 1) == 0) || (0x20 < local_4c0)) ||
               (0x20 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0))) {
              iVar13 = (int)((ulong)in_stack_fffffffffffff730 >> 0x20);
              if ((local_4b8[0x38] & 1) == 0) {
                conv3x3s1_winograd23_transform_kernel
                          ((Mat *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                           in_stack_fffffffffffff738,iVar13,(int)in_stack_fffffffffffff730,
                           in_stack_fffffffffffff728);
              }
              else {
                conv3x3s1_winograd43_transform_kernel
                          ((Mat *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                           in_stack_fffffffffffff738,iVar13,(int)in_stack_fffffffffffff730,
                           in_stack_fffffffffffff728);
              }
            }
            else {
              conv3x3s1_winograd63_transform_kernel
                        (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                         in_stack_fffffffffffff744,in_stack_fffffffffffff740,
                         (Option *)in_stack_fffffffffffff738);
            }
          }
          else {
            bVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::empty
                              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                               CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
            if (((bVar5) ||
                (pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                    ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                     ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8),0),
                pvVar8->w == 0)) ||
               (pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                   ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                    ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8),0),
               pvVar8->h == 0)) {
              pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                  ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa0),0);
              local_5f8 = pvVar8->w;
              pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                  ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa0),0);
              local_5fc = pvVar8->h;
              if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) < 1) &&
                  (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) < 1)) &&
                 ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4) < 1 &&
                  (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) < 1)))) {
                if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) == -0xe9) &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) == -0xe9)) &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4) == -0xe9 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) == -0xe9)))) ||
                   ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) == -0xea &&
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) == -0xea)) &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4) == -0xea)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) == -0xea)))) {
                  local_5f8 = local_5f8 + 2;
                  local_5fc = local_5fc + 2;
                }
              }
              else {
                local_5f8 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) +
                            *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) + local_5f8;
                local_5fc = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4) +
                            *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) + local_5fc;
              }
            }
            else {
              pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                  ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8),0);
              local_5f8 = pvVar8->w + 2;
              pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                  ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8),0);
              local_5fc = pvVar8->h + 2;
            }
            local_5fd = test_prefer_winograd63
                                  (in_stack_fffffffffffff540,
                                   (int)((ulong)in_stack_fffffffffffff538 >> 0x20),
                                   (int)in_stack_fffffffffffff538,in_stack_fffffffffffff534);
            local_5fe = test_prefer_winograd23
                                  (iVar13,in_stack_fffffffffffff56c,in_stack_fffffffffffff568,
                                   in_stack_fffffffffffff564);
            local_5ff = 0;
            if ((local_5fd & 1) == 0) {
              local_5ff = local_5fe ^ 0xff;
            }
            local_5ff = local_5ff & 1;
            if ((local_5fe) && ((local_4b8[0x37] & 1) == 0)) {
              local_5fe = false;
              local_5ff = 1;
            }
            if (((local_5fd & 1) != 0) && ((local_4b8[0x39] & 1) == 0)) {
              local_5fd = 0;
              local_5ff = 1;
            }
            if ((local_5ff != 0) && ((local_4b8[0x38] & 1) == 0)) {
              local_5ff = 0;
              if ((local_4b8[0x39] & 1) == 0) {
                local_5fe = true;
              }
              else {
                local_5fd = 1;
              }
            }
            iVar13 = (int)((ulong)in_stack_fffffffffffff730 >> 0x20);
            if (local_5fe == false) {
              if (local_5ff == 0) {
                if ((local_5fd & 1) != 0) {
                  conv3x3s1_winograd63_transform_kernel
                            (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                             in_stack_fffffffffffff744,in_stack_fffffffffffff740,
                             (Option *)in_stack_fffffffffffff738);
                }
              }
              else {
                conv3x3s1_winograd43_transform_kernel
                          ((Mat *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                           in_stack_fffffffffffff738,iVar13,(int)in_stack_fffffffffffff730,
                           in_stack_fffffffffffff728);
              }
            }
            else {
              conv3x3s1_winograd23_transform_kernel
                        ((Mat *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                         in_stack_fffffffffffff738,iVar13,(int)in_stack_fffffffffffff730,
                         in_stack_fffffffffffff728);
            }
          }
          if ((*local_4b8 & 1) != 0) {
            lVar1 = *(long *)(*in_RDI + -0x18);
            puVar7 = (undefined8 *)((long)in_RDI + lVar1 + 0x160);
            if (*(long *)((long)in_RDI + lVar1 + 0x168) != 0) {
              piVar3 = *(int **)((long)in_RDI + lVar1 + 0x168);
              local_194 = 0xffffffff;
              LOCK();
              local_198 = *piVar3;
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (local_198 == 1) {
                local_190 = puVar7;
                if (*(long *)((long)in_RDI + lVar1 + 0x180) == 0) {
                  local_118 = (void *)*puVar7;
                  if (local_118 != (void *)0x0) {
                    free(local_118);
                  }
                }
                else {
                  plVar2 = *(long **)((long)in_RDI + lVar1 + 0x180);
                  (**(code **)(*plVar2 + 0x18))(plVar2,*puVar7);
                }
              }
            }
            *puVar7 = 0;
            puVar7[2] = 0;
            *(undefined4 *)(puVar7 + 3) = 0;
            *(undefined4 *)(puVar7 + 5) = 0;
            *(undefined4 *)((long)puVar7 + 0x2c) = 0;
            *(undefined4 *)(puVar7 + 6) = 0;
            *(undefined4 *)((long)puVar7 + 0x34) = 0;
            *(undefined4 *)(puVar7 + 7) = 0;
            puVar7[8] = 0;
            puVar7[1] = 0;
          }
          local_4a4 = 0;
        }
      }
    }
    else {
      local_4a4 = create_pipeline_int8_x86
                            (in_stack_fffffffffffff570,
                             (Option *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568)
                            );
    }
  }
  else {
    local_4a4 = 0;
  }
  return local_4a4;
}

Assistant:

int Convolution_x86_avx::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else
    {
        if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
                || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}